

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O3

bool __thiscall cmCTestTestHandler::ComputeTestList(cmCTestTestHandler *this)

{
  byte bVar1;
  cmCTestTestProperties *pcVar2;
  cmCTestTestProperties *pcVar3;
  pointer pcVar4;
  pointer piVar5;
  pointer piVar6;
  bool bVar7;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var8;
  cmCTestTestProperties *this_00;
  iterator __end1;
  size_t numTests;
  long lVar9;
  uint uVar10;
  size_t sVar11;
  iterator __begin1;
  pointer pcVar12;
  int cnt;
  ListOfTests finalList;
  string last_directory;
  int local_70;
  int local_6c;
  vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
  local_68;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  pcVar2 = (this->TestList).
           super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar3 = (this->TestList).
           super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = pcVar2;
  if (pcVar3 != pcVar2) {
    do {
      cmCTestTestProperties::~cmCTestTestProperties(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pcVar3);
    (this->TestList).
    super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
    ._M_impl.super__Vector_impl_data._M_finish = pcVar2;
  }
  bVar7 = GetListOfTests(this);
  if (bVar7) {
    if (this->RerunFailed == true) {
      ComputeTestListForRerunFailed(this);
    }
    else {
      pcVar12 = (this->TestList).
                super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pcVar4 = (this->TestList).
               super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar9 = (long)pcVar4 - (long)pcVar12;
      sVar11 = 0;
      if (pcVar4 != pcVar12) {
        do {
          CheckLabelFilterInclude(this,pcVar12);
          CheckLabelFilterExclude(this,pcVar12);
          uVar10 = (int)sVar11 + (uint)pcVar12->IsInBasedOnREOptions;
          sVar11 = (size_t)uVar10;
          pcVar12 = pcVar12 + 1;
        } while (pcVar12 != pcVar4);
        sVar11 = (size_t)uVar10;
      }
      numTests = (long)((int)((ulong)lVar9 >> 8) * -0x55555555);
      if (this->UseUnion == false) {
        numTests = sVar11;
      }
      ExpandTestsToRunInformation(this,numTests);
      local_70 = 0;
      local_6c = 0;
      local_50 = &local_40;
      local_48 = 0;
      local_40 = 0;
      local_68.
      super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_68.
      super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pcVar12 = (this->TestList).
                super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pcVar4 = (this->TestList).
               super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pcVar12 != pcVar4) {
        do {
          local_70 = local_70 + 1;
          bVar1 = pcVar12->IsInBasedOnREOptions;
          if ((bool)bVar1 == true) {
            local_6c = local_6c + 1;
          }
          piVar5 = (this->TestsToRun).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar6 = (this->TestsToRun).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (this->UseUnion == true) {
            if ((piVar5 != piVar6) &&
               (_Var8 = std::
                        __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                                  (piVar5,piVar6,&local_70),
               _Var8._M_current ==
               (this->TestsToRun).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish)) {
              bVar1 = pcVar12->IsInBasedOnREOptions;
              goto joined_r0x001d0597;
            }
LAB_001d0599:
            pcVar12->Index = local_70;
            std::
            vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
            ::push_back(&local_68,pcVar12);
          }
          else if (piVar5 == piVar6) {
joined_r0x001d0597:
            if (bVar1 != 0) goto LAB_001d0599;
          }
          else {
            _Var8 = std::
                    __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                              (piVar5,piVar6,&local_6c);
            if (_Var8._M_current !=
                (this->TestsToRun).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              bVar1 = pcVar12->IsInBasedOnREOptions & 1;
              goto joined_r0x001d0597;
            }
          }
          pcVar12 = pcVar12 + 1;
        } while (pcVar12 != pcVar4);
      }
      UpdateForFixtures(this,&local_68);
      this->TotalNumberOfTests =
           ((long)(this->TestList).
                  super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->TestList).
                  super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 8) * -0x5555555555555555;
      std::
      vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
      ::operator=(&this->TestList,&local_68);
      UpdateMaxTestNameWidth(this);
      std::
      vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
      ::~vector(&local_68);
      if (local_50 != &local_40) {
        operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      }
    }
  }
  return bVar7;
}

Assistant:

bool cmCTestTestHandler::ComputeTestList()
{
  this->TestList.clear(); // clear list of test
  if (!this->GetListOfTests()) {
    return false;
  }

  if (this->RerunFailed) {
    this->ComputeTestListForRerunFailed();
    return true;
  }

  cmCTestTestHandler::ListOfTests::size_type tmsize = this->TestList.size();
  // how many tests are in based on RegExp?
  int inREcnt = 0;
  for (cmCTestTestProperties& tp : this->TestList) {
    this->CheckLabelFilter(tp);
    if (tp.IsInBasedOnREOptions) {
      inREcnt++;
    }
  }
  // expand the test list based on the union flag
  if (this->UseUnion) {
    this->ExpandTestsToRunInformation(static_cast<int>(tmsize));
  } else {
    this->ExpandTestsToRunInformation(inREcnt);
  }
  // Now create a final list of tests to run
  int cnt = 0;
  inREcnt = 0;
  std::string last_directory;
  ListOfTests finalList;
  for (cmCTestTestProperties& tp : this->TestList) {
    cnt++;
    if (tp.IsInBasedOnREOptions) {
      inREcnt++;
    }

    if (this->UseUnion) {
      // if it is not in the list and not in the regexp then skip
      if ((!this->TestsToRun.empty() &&
           !cm::contains(this->TestsToRun, cnt)) &&
          !tp.IsInBasedOnREOptions) {
        continue;
      }
    } else {
      // is this test in the list of tests to run? If not then skip it
      if ((!this->TestsToRun.empty() &&
           !cm::contains(this->TestsToRun, inREcnt)) ||
          !tp.IsInBasedOnREOptions) {
        continue;
      }
    }
    tp.Index = cnt; // save the index into the test list for this test
    finalList.push_back(tp);
  }

  this->UpdateForFixtures(finalList);

  // Save the total number of tests before exclusions
  this->TotalNumberOfTests = this->TestList.size();
  // Set the TestList to the final list of all test
  this->TestList = finalList;

  this->UpdateMaxTestNameWidth();
  return true;
}